

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

TranslationBlock *
tb_gen_code_mips64(CPUState *cpu,target_ulong pc,target_ulong cs_base,uint32_t flags,int cflags)

{
  ushort uVar1;
  int iVar2;
  TCGContext_conflict5 *s;
  TCGContext_conflict6 *pTVar3;
  byte *pbVar4;
  uc_struct *uc;
  uintptr_t uVar5;
  uintptr_t *puVar6;
  PageDesc *pPVar7;
  uint uVar8;
  TranslationBlock *tb;
  ulong extraout_RAX;
  byte *pbVar9;
  long lVar10;
  tb_page_addr_t tVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  TranslationBlock *pTVar18;
  target_ulong tVar19;
  tb_page_addr_t phys2;
  PageDesc *p2;
  PageDesc *p;
  PageDesc *local_88;
  uint local_80;
  undefined4 uStack_7c;
  tb_page_addr_t local_78;
  void *local_70;
  uint32_t local_68;
  uint32_t local_64;
  target_ulong local_60;
  CPUArchState_conflict11 *local_58;
  byte *local_50;
  CPUState *local_48;
  target_ulong local_40;
  TranslationBlock *local_38;
  
  s = (TCGContext_conflict5 *)cpu->uc->tcg_ctx;
  local_58 = (CPUArchState_conflict11 *)cpu->env_ptr;
  local_64 = flags;
  local_40 = cs_base;
  local_78 = get_page_addr_code_mips64(local_58,pc);
  uVar12 = cflags | 0x10000;
  if (local_78 != 0xffffffffffffffff) {
    uVar12 = cflags;
  }
  uVar8 = cpu->cluster_index;
  iVar2 = cpu->singlestep_enabled;
  tb = tcg_tb_alloc_mips64(s);
  pTVar18 = (TranslationBlock *)(ulong)uVar8;
  if (tb == (TranslationBlock *)0x0) {
LAB_0088ed3b:
    tb_gen_code_mips64_cold_2();
    tb = pTVar18;
LAB_0088ed45:
    tb_page_remove((PageDesc *)CONCAT44(uStack_7c,local_80),tb);
    lVar10 = CONCAT44(uStack_7c,local_80);
    g_free(*(gpointer *)(lVar10 + 8));
    *(undefined8 *)(lVar10 + 8) = 0;
    *(undefined4 *)(lVar10 + 0x10) = 0;
    if (local_88 != (PageDesc *)0x0) {
      tb_page_remove(local_88,tb);
      pPVar7 = local_88;
      g_free(local_88->code_bitmap);
      pPVar7->code_bitmap = (unsigned_long *)0x0;
      pPVar7->code_write_count = 0;
    }
    if (local_38 == tb) {
LAB_0088ed1d:
      tcg_tb_insert_mips64(s,tb);
    }
    else {
      lVar10 = (long)s->uc->qemu_icache_linesize;
      s->code_gen_ptr = (void *)((long)local_70 - (-lVar10 & lVar10 + 0x9fU));
      tb = local_38;
    }
    return tb;
  }
  local_68 = uVar8 << 0x18 | uVar12 & 0xffffff;
  uVar12 = uVar12 & 0x7fff;
  uVar8 = 0x200;
  if (uVar12 < 0x200) {
    uVar8 = uVar12;
  }
  if (uVar12 == 0) {
    uVar8 = 0x200;
  }
  uVar12 = 1;
  if (iVar2 == 0) {
    uVar12 = uVar8;
  }
  local_48 = (CPUState *)(local_58[-3].tcs[0xc].gpr + 0x12);
  local_60 = pc;
LAB_0088e820:
  local_70 = s->code_gen_ptr;
  (tb->tc).ptr = local_70;
  tb->pc = local_60;
  tb->cs_base = local_40;
  tb->flags = local_64;
  tb->cflags = local_68;
  tb->orig_tb = (TranslationBlock *)0x0;
  tb->trace_vcpu_dstate = (uint32_t)cpu->trace_dstate[0];
  s->tb_cflags = local_68;
  uVar8 = uVar12;
  do {
    uVar12 = uVar8;
    tcg_func_start_mips64(s);
    s->cpu = local_48;
    gen_intermediate_code_mips64(cpu,tb,uVar12);
    s->cpu = (CPUState *)0x0;
    tb->jmp_reset_offset[0] = 0xffff;
    tb->jmp_reset_offset[1] = 0xffff;
    s->tb_jmp_reset_offset = tb->jmp_reset_offset;
    s->tb_jmp_insn_offset = tb->jmp_target_arg;
    s->tb_jmp_target_addr = (uintptr_t *)0x0;
    uVar8 = tcg_gen_code_mips64(s,tb);
    if (-1 < (int)uVar8) {
      uVar14 = (ulong)uVar8;
      local_50 = (byte *)((long)local_70 + uVar14);
      uVar1 = tb->icount;
      pbVar9 = local_50;
      if ((ulong)uVar1 == 0) goto LAB_0088ea46;
      pTVar3 = cpu->uc->tcg_ctx;
      pbVar4 = (byte *)pTVar3->code_gen_highwater;
      uVar16 = 0;
      goto LAB_0088e94b;
    }
    tb_gen_code_mips64_cold_1();
    uVar8 = local_80;
  } while ((extraout_RAX & 1) == 0);
  goto LAB_0088e8e3;
  while (uVar16 = uVar16 + 1, uVar16 != uVar1) {
LAB_0088e94b:
    lVar10 = 0;
    do {
      if (uVar16 == 0) {
        pTVar18 = tb;
        if (lVar10 == 0) goto LAB_0088e963;
        tVar19 = 0;
      }
      else {
        pTVar18 = (TranslationBlock *)(pTVar3->gen_insn_data[uVar16 - 1] + lVar10);
LAB_0088e963:
        tVar19 = pTVar18->pc;
      }
      uVar17 = pTVar3->gen_insn_data[uVar16][lVar10] - tVar19;
      while ((0x3f < uVar17 &&
             (((long)uVar17 >> 7 == 0xffffffffffffffffU & (byte)(((uint)uVar17 & 0x40) >> 6)) == 0))
            ) {
        *pbVar9 = (byte)uVar17 | 0x80;
        pbVar9 = pbVar9 + 1;
        uVar17 = (long)uVar17 >> 7;
      }
      *pbVar9 = (byte)uVar17 & 0x7f;
      pbVar9 = pbVar9 + 1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    if (uVar16 == 0) {
      uVar17 = 0;
    }
    else {
      uVar17 = (ulong)pTVar3->gen_insn_end_off[uVar16 - 1];
    }
    uVar17 = pTVar3->gen_insn_end_off[uVar16] - uVar17;
    while ((0x3f < uVar17 &&
           (((long)uVar17 >> 7 == 0xffffffffffffffffU & (byte)(((uint)uVar17 & 0x40) >> 6)) == 0)))
    {
      *pbVar9 = (byte)uVar17 | 0x80;
      pbVar9 = pbVar9 + 1;
      uVar17 = (long)uVar17 >> 7;
    }
    *pbVar9 = (byte)uVar17 & 0x7f;
    pbVar9 = pbVar9 + 1;
    if (pbVar4 < pbVar9) goto LAB_0088e8e3;
  }
LAB_0088ea46:
  uVar8 = (int)pbVar9 - (int)local_50;
  if (-1 < (int)uVar8) {
    (tb->tc).size = uVar14;
    s->code_gen_ptr =
         (void *)((long)local_70 + (uVar8 & 0x7fffffff) + uVar14 + 0xf & 0xfffffffffffffff0);
    *(undefined1 (*) [16])(tb->jmp_list_next + 1) = (undefined1  [16])0x0;
    tb->jmp_list_head = 0;
    tb->jmp_list_next[0] = 0;
    tb->jmp_dest[1] = 0;
    if ((ulong)tb->jmp_reset_offset[0] != 0xffff) {
      tb_set_jmp_target_mips64
                ((TranslationBlock_conflict *)tb,0,
                 (ulong)tb->jmp_reset_offset[0] + (long)(tb->tc).ptr);
    }
    tVar19 = local_60;
    tVar11 = local_78;
    if ((ulong)tb->jmp_reset_offset[1] != 0xffff) {
      tb_set_jmp_target_mips64
                ((TranslationBlock_conflict *)tb,1,
                 (ulong)tb->jmp_reset_offset[1] + (long)(tb->tc).ptr);
    }
    uVar14 = (tVar19 + tb->size) - 1 & 0xfffffffffffff000;
    phys2 = 0xffffffffffffffff;
    if ((tVar19 & 0xfffffffffffff000) != uVar14) {
      phys2 = get_page_addr_code_mips64(local_58,uVar14);
    }
    uc = (uc_struct *)cpu->uc;
    local_88 = (PageDesc *)0x0;
    if (tVar11 == 0xffffffffffffffff) {
      if ((tb->cflags & 0x10000) == 0) {
        __assert_fail("tb->cflags & CF_NOCACHE",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                      ,0x66c,
                      "TranslationBlock *tb_link_page(struct uc_struct *, TranslationBlock *, tb_page_addr_t, tb_page_addr_t)"
                     );
      }
      *(undefined4 *)tb->page_addr = 0xffffffff;
      *(undefined4 *)((long)tb->page_addr + 4) = 0xffffffff;
      *(undefined4 *)(tb->page_addr + 1) = 0xffffffff;
      *(undefined4 *)((long)tb->page_addr + 0xc) = 0xffffffff;
      goto LAB_0088ed1d;
    }
    page_lock_pair((uc_struct_conflict6 *)uc,(PageDesc **)&local_80,tVar11,&local_88,phys2,1);
    puVar6 = (uintptr_t *)CONCAT44(uStack_7c,local_80);
    tb->page_addr[0] = tVar11 & 0xfffffffffffff000;
    uVar5 = *puVar6;
    tb->page_next[0] = uVar5;
    *puVar6 = (uintptr_t)tb;
    g_free((gpointer)puVar6[1]);
    puVar6[1] = 0;
    *(undefined4 *)(puVar6 + 2) = 0;
    if (uVar5 == 0) {
      tlb_protect_code_mips64((uc_struct_conflict6 *)uc,tVar11 & 0xfffffffffffff000);
    }
    pPVar7 = local_88;
    if (local_88 == (PageDesc *)0x0) {
      tb->page_addr[1] = 0xffffffffffffffff;
      tVar11 = local_78;
    }
    else {
      tb->page_addr[1] = phys2;
      uVar5 = local_88->first_tb;
      tb->page_next[1] = uVar5;
      local_88->first_tb = (ulong)tb | 1;
      g_free(local_88->code_bitmap);
      tVar11 = local_78;
      pPVar7->code_bitmap = (unsigned_long *)0x0;
      pPVar7->code_write_count = 0;
      if (uVar5 == 0) {
        tlb_protect_code_mips64((uc_struct_conflict6 *)uc,phys2);
      }
    }
    if ((tb->cflags >> 0x10 & 1) != 0) goto LAB_0088ed1d;
    local_38 = (TranslationBlock *)0x0;
    uVar12 = (int)tVar11 * -0x7a143589 + 0x24234429;
    uVar15 = uVar12 * 0x2000 | uVar12 >> 0x13;
    uVar12 = (int)(tVar11 >> 0x20) * -0x7a143589 + 0x85ebca78;
    uVar8 = uVar12 * 0x2000 | uVar12 >> 0x13;
    uVar12 = (int)tb->pc * -0x7a143589 + 1;
    uVar13 = uVar12 * 0x2000 | uVar12 >> 0x13;
    uVar12 = (int)(tb->pc >> 0x20) * -0x7a143589 + 0x61c88650;
    uVar12 = uVar12 * 0x2000 | uVar12 >> 0x13;
    uVar12 = (uVar12 * -0x193c0000 | uVar12 * -0x61c8864f >> 0xe) +
             tb->flags * -0x3d4d51c3 +
             (uVar15 * 0x3c6ef362 | (uint)((int)(uVar15 * -0x61c8864f) < 0)) +
             (uVar8 * 0x1bbcd880 | uVar8 * -0x61c8864f >> 0x19) +
             (uVar13 * 0x779b1000 | uVar13 * -0x61c8864f >> 0x14) + 0x1c;
    uVar12 = (tb->cflags & 0xff0affff) * -0x3d4d51c3 +
             (uVar12 * 0x20000 | uVar12 >> 0xf) * 0x27d4eb2f;
    uVar12 = tb->trace_vcpu_dstate * -0x3d4d51c3 + (uVar12 * 0x20000 | uVar12 >> 0xf) * 0x27d4eb2f;
    uVar12 = (uVar12 * 0x20000 | uVar12 >> 0xf) * 0x27d4eb2f;
    uVar12 = (uVar12 >> 0xf ^ uVar12) * -0x7a143589;
    uVar12 = (uVar12 >> 0xd ^ uVar12) * -0x3d4d51c3;
    uVar12 = uVar12 >> 0x10 ^ uVar12;
    tb->hash = uVar12;
    qht_insert(uc,(qht *)(uc->tcg_ctx[1].free_temps[1].l + 4),tb,uVar12,&local_38);
    if (local_38 == (TranslationBlock *)0x0) goto LAB_0088ed1d;
    goto LAB_0088ed45;
  }
LAB_0088e8e3:
  tb = tcg_tb_alloc_mips64(s);
  pTVar18 = tb;
  if (tb == (TranslationBlock *)0x0) goto LAB_0088ed3b;
  goto LAB_0088e820;
}

Assistant:

TranslationBlock *tb_gen_code(CPUState *cpu,
                              target_ulong pc, target_ulong cs_base,
                              uint32_t flags, int cflags)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    CPUArchState *env = cpu->env_ptr;
    TranslationBlock *tb, *existing_tb;
    tb_page_addr_t phys_pc, phys_page2;
    target_ulong virt_page2;
    tcg_insn_unit *gen_code_buf;
    int gen_code_size, search_size, max_insns;

    assert_memory_lock();
#ifdef HAVE_PTHREAD_JIT_PROTECT
    tb_exec_unlock(tcg_ctx);
#endif
    phys_pc = get_page_addr_code(env, pc);

    if (phys_pc == -1) {
        /* Generate a temporary TB; do not cache */
        cflags |= CF_NOCACHE;
    }

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    max_insns = cflags & CF_COUNT_MASK;
    if (max_insns == 0) {
        max_insns = CF_COUNT_MASK;
    }
    if (max_insns > TCG_MAX_INSNS) {
        max_insns = TCG_MAX_INSNS;
    }
    if (cpu->singlestep_enabled) {
        max_insns = 1;
    }

 buffer_overflow:
    tb = tcg_tb_alloc(tcg_ctx);
    if (unlikely(!tb)) {
        /* flush must be done */
        tb_flush(cpu);
        mmap_unlock();
        /* Make the execution loop process the flush as soon as possible.  */
        cpu->exception_index = EXCP_INTERRUPT;
        cpu_loop_exit(cpu);
    }

    gen_code_buf = tcg_ctx->code_gen_ptr;
    tb->tc.ptr = gen_code_buf;
    tb->pc = pc;
    tb->cs_base = cs_base;
    tb->flags = flags;
    tb->cflags = cflags;
    tb->orig_tb = NULL;
    tb->trace_vcpu_dstate = *cpu->trace_dstate;
    tcg_ctx->tb_cflags = cflags;
 tb_overflow:

    tcg_func_start(tcg_ctx);

    tcg_ctx->cpu = env_cpu(env);
    UC_TRACE_START(UC_TRACE_TB_TRANS);
    gen_intermediate_code(cpu, tb, max_insns);
    UC_TRACE_END(UC_TRACE_TB_TRANS, "[uc] translate tb 0x%" PRIx64 ": ", tb->pc);
    tcg_ctx->cpu = NULL;

    /* generate machine code */
    tb->jmp_reset_offset[0] = TB_JMP_RESET_OFFSET_INVALID;
    tb->jmp_reset_offset[1] = TB_JMP_RESET_OFFSET_INVALID;
    tcg_ctx->tb_jmp_reset_offset = tb->jmp_reset_offset;
    if (TCG_TARGET_HAS_direct_jump) {
        tcg_ctx->tb_jmp_insn_offset = tb->jmp_target_arg;
        tcg_ctx->tb_jmp_target_addr = NULL;
    } else {
        tcg_ctx->tb_jmp_insn_offset = NULL;
        tcg_ctx->tb_jmp_target_addr = tb->jmp_target_arg;
    }

    gen_code_size = tcg_gen_code(tcg_ctx, tb);
    if (unlikely(gen_code_size < 0)) {
        switch (gen_code_size) {
        case -1:
            /*
             * Overflow of code_gen_buffer, or the current slice of it.
             *
             * TODO: We don't need to re-do gen_intermediate_code, nor
             * should we re-do the tcg optimization currently hidden
             * inside tcg_gen_code.  All that should be required is to
             * flush the TBs, allocate a new TB, re-initialize it per
             * above, and re-do the actual code generation.
             */
            goto buffer_overflow;

        case -2:
            /*
             * The code generated for the TranslationBlock is too large.
             * The maximum size allowed by the unwind info is 64k.
             * There may be stricter constraints from relocations
             * in the tcg backend.
             *
             * Try again with half as many insns as we attempted this time.
             * If a single insn overflows, there's a bug somewhere...
             */
            max_insns = tb->icount;
            assert(max_insns > 1);
            max_insns /= 2;
            goto tb_overflow;

        default:
            g_assert_not_reached();
        }
    }
    search_size = encode_search(cpu->uc, tb, (uint8_t *)gen_code_buf + gen_code_size);
    if (unlikely(search_size < 0)) {
        goto buffer_overflow;
    }
    tb->tc.size = gen_code_size;

    tcg_ctx->code_gen_ptr = (void *)
        ROUND_UP((uintptr_t)gen_code_buf + gen_code_size + search_size,
                 CODE_GEN_ALIGN);

    /* init jump list */
    tb->jmp_list_head = (uintptr_t)NULL;
    tb->jmp_list_next[0] = (uintptr_t)NULL;
    tb->jmp_list_next[1] = (uintptr_t)NULL;
    tb->jmp_dest[0] = (uintptr_t)NULL;
    tb->jmp_dest[1] = (uintptr_t)NULL;

    /* init original jump addresses which have been set during tcg_gen_code() */
    if (tb->jmp_reset_offset[0] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 0);
    }
    if (tb->jmp_reset_offset[1] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 1);
    }

    /* check next page if needed */
    virt_page2 = (pc + tb->size - 1) & TARGET_PAGE_MASK;
    phys_page2 = -1;
    if ((pc & TARGET_PAGE_MASK) != virt_page2) {
        phys_page2 = get_page_addr_code(env, virt_page2);
    }
    /*
     * No explicit memory barrier is required -- tb_link_page() makes the
     * TB visible in a consistent state.
     */
    existing_tb = tb_link_page(cpu->uc, tb, phys_pc, phys_page2);
    /* if the TB already exists, discard what we just translated */
    if (unlikely(existing_tb != tb)) {
        uintptr_t orig_aligned = (uintptr_t)gen_code_buf;

        orig_aligned -= ROUND_UP(sizeof(*tb), tcg_ctx->uc->qemu_icache_linesize);
        tcg_ctx->code_gen_ptr = (void *)orig_aligned;
        return existing_tb;
    }
    tcg_tb_insert(tcg_ctx, tb);
    return tb;
}